

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetGXPortStatus(ndicapi *pol,int port)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  int i;
  long lVar5;
  
  if (port - 0x31U < 3) {
    pcVar4 = pol->GxStatus + (port * -2 + 0x68);
  }
  else {
    if (port - 0x41U < 3) {
      iVar2 = 0x88;
    }
    else if (port - 0x44U < 3) {
      iVar2 = 0x96;
    }
    else {
      if (2 < port - 0x47U) {
        return 0;
      }
      iVar2 = 0xa4;
    }
    pcVar4 = pol->GxPassiveStatus + (uint)(iVar2 + port * -2);
  }
  lVar5 = 0;
  uVar3 = 0;
  while( true ) {
    cVar1 = pcVar4[lVar5];
    iVar2 = -0x57;
    if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar2 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
       (iVar2 = -0x30, 9 < (byte)(cVar1 - 0x30U))) break;
    uVar3 = uVar3 << 4 | iVar2 + cVar1;
    lVar5 = lVar5 + 1;
    if (lVar5 == 2) {
      return uVar3;
    }
  }
  return uVar3;
}

Assistant:

ndicapiExport int ndiGetGXPortStatus(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = &pol->GxStatus[6 - 2 * (port - '1')];
  }
  else if (port >= 'A' && port <= 'C')
  {
    dp = &pol->GxPassiveStatus[6 - 2 * (port - 'A')];
  }
  else if (port >= 'D' && port <= 'F')
  {
    dp = &pol->GxPassiveStatus[14 - 2 * (port - 'D')];
  }
  else if (port >= 'G' && port <= 'I')
  {
    dp = &pol->GxPassiveStatus[22 - 2 * (port - 'G')];
  }
  else
  {
    return 0;
  }

  return (int)ndiHexToUnsignedLong(dp, 2);
}